

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

bool __thiscall
HdlcSimulationDataGenerator::ContainsElement(HdlcSimulationDataGenerator *this,U32 index)

{
  const_reference pvVar1;
  uint uVar2;
  ulong __n;
  ulong uVar3;
  
  uVar2 = 0;
  do {
    __n = (ulong)uVar2;
    uVar3 = (long)(this->mAbortFramesIndexes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->mAbortFramesIndexes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar3 <= __n) break;
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->mAbortFramesIndexes,__n);
    uVar2 = uVar2 + 1;
  } while (*pvVar1 != index);
  return __n < uVar3;
}

Assistant:

bool HdlcSimulationDataGenerator::ContainsElement( U32 index ) const
{
    for( U32 i = 0; i < mAbortFramesIndexes.size(); ++i )
    {
        if( mAbortFramesIndexes.at( i ) == index )
        {
            return true;
        }
    }
    return false;
}